

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

Reals Omega_h::diffuse_densities
                (Mesh *mesh,Graph *g,Reals *densities,Reals *cell_sizes,VarCompareOpts opts,
                string *name,bool verbose)

{
  bool bVar1;
  I32 IVar2;
  element_type *this;
  ostream *poVar3;
  void *extraout_RDX;
  undefined7 in_register_00000089;
  Reals RVar4;
  byte in_stack_00000020;
  Read<double> local_d8;
  Read<double> local_c8;
  Graph local_b8;
  Read<double> local_98 [2];
  Read<double> local_78;
  shared_ptr<Omega_h::Comm> local_68;
  int local_54;
  undefined1 local_50 [4];
  Int niters;
  CommPtr comm;
  bool verbose_local;
  string *name_local;
  Reals *cell_sizes_local;
  Reals *densities_local;
  Graph *g_local;
  Mesh *mesh_local;
  
  comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       in_stack_00000020 & 1;
  Mesh::comm((Mesh *)local_50);
  local_54 = 0;
  while( true ) {
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_68,(shared_ptr<Omega_h::Comm> *)local_50);
    Read<double>::Read(&local_78,cell_sizes);
    bVar1 = all_bounded(&local_68,&local_78,opts.tolerance);
    Read<double>::~Read(&local_78);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_68);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    Graph::Graph(&local_b8,(Graph *)densities);
    Read<double>::Read(&local_c8,cell_sizes);
    Read<double>::Read(&local_d8,(Read<double> *)name);
    diffuse_densities_once((Omega_h *)local_98,(Mesh *)g,&local_b8,&local_c8,&local_d8);
    Read<double>::operator=(cell_sizes,local_98);
    Read<double>::~Read(local_98);
    Read<double>::~Read(&local_d8);
    Read<double>::~Read(&local_c8);
    Graph::~Graph(&local_b8);
    local_54 = local_54 + 1;
  }
  if ((comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ &
      1) != 0) {
    this = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
    IVar2 = Comm::rank(this);
    if (IVar2 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"diffused ");
      poVar3 = std::operator<<(poVar3,(string *)CONCAT71(in_register_00000089,verbose));
      poVar3 = std::operator<<(poVar3," in ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_54);
      std::operator<<(poVar3," iterations\n");
    }
  }
  Read<double>::Read((Read<double> *)mesh,(Read<signed_char> *)cell_sizes);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_50);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)mesh;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

static Reals diffuse_densities(Mesh* mesh, Graph g, Reals densities,
    Reals cell_sizes, VarCompareOpts opts, std::string const& name,
    bool verbose) {
  auto comm = mesh->comm();
  Int niters = 0;
  for (niters = 0; !all_bounded(comm, densities, opts.tolerance); ++niters) {
    densities = diffuse_densities_once(mesh, g, densities, cell_sizes);
  }
  if (verbose && !comm->rank()) {
    std::cout << "diffused " << name << " in " << niters << " iterations\n";
  }
  return densities;
}